

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O3

int LimitPayloadUb(ISACUBEncStruct *ISACencUB_obj,uint16_t payloadLimitBytes,
                  double bytesLeftSpecCoding,transcode_obj *transcodingParam,int16_t *fre,
                  int16_t *fim,double *lpcGains,ISACBand band,int status)

{
  double *lpGains;
  uint32_t uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  uint32_t uVar7;
  long lVar8;
  int iVar9;
  uint uVar10;
  undefined6 in_register_00000032;
  
  uVar10 = (uint)CONCAT62(in_register_00000032,payloadLimitBytes);
  lpGains = transcodingParam->hiFiltGain;
  iVar9 = 0;
  while( true ) {
    if (iVar9 == 5) {
      return -0x1932;
    }
    if (status == -0x1928) {
      dVar2 = (bytesLeftSpecCoding / 600.0) * 0.5;
    }
    else {
      dVar2 = bytesLeftSpecCoding /
              (double)((ISACencUB_obj->bitstr_obj).stream_index - transcodingParam->stream_index);
    }
    dVar2 = (((double)iVar9 * -0.9) / 5.0 + 1.0) * dVar2;
    if (band == kIsacUpperBand16) {
      lVar8 = -6;
      do {
        dVar3 = (lpGains + lVar8)[1];
        dVar4 = transcodingParam->hiFiltGain[lVar8 + 6];
        dVar5 = (transcodingParam->hiFiltGain + lVar8 + 6)[1];
        lpGains[lVar8] = lpGains[lVar8] * dVar2;
        (lpGains + lVar8)[1] = dVar3 * dVar2;
        transcodingParam->hiFiltGain[lVar8 + 6] = dVar4 * dVar2;
        (transcodingParam->hiFiltGain + lVar8 + 6)[1] = dVar5 * dVar2;
        lVar8 = lVar8 + 2;
      } while (lVar8 != 0);
    }
    else {
      lVar8 = 0;
      do {
        dVar3 = (transcodingParam->loFiltGain + lVar8)[1];
        transcodingParam->loFiltGain[lVar8] = transcodingParam->loFiltGain[lVar8] * dVar2;
        (transcodingParam->loFiltGain + lVar8)[1] = dVar3 * dVar2;
        lVar8 = lVar8 + 2;
      } while (lVar8 != 6);
    }
    lVar8 = 0;
    do {
      fre[lVar8] = (int16_t)(int)((double)(int)fre[lVar8] * dVar2 + 0.5);
      fim[lVar8] = (int16_t)(int)((double)(int)fim[lVar8] * dVar2 + 0.5);
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0xf0);
    memcpy((ISACencUB_obj->SaveEnc_obj).realFFT,fre,0x1e0);
    memcpy((ISACencUB_obj->SaveEnc_obj).imagFFT,fim,0x1e0);
    uVar1 = transcodingParam->stream_index;
    (ISACencUB_obj->bitstr_obj).stream_index = uVar1;
    uVar7 = transcodingParam->streamval;
    (ISACencUB_obj->bitstr_obj).W_upper = transcodingParam->W_upper;
    (ISACencUB_obj->bitstr_obj).streamval = uVar7;
    (ISACencUB_obj->bitstr_obj).stream[uVar1 - 2] = transcodingParam->stream[0];
    (ISACencUB_obj->bitstr_obj).stream[transcodingParam->stream_index - 1] =
         transcodingParam->stream[1];
    (ISACencUB_obj->bitstr_obj).stream[transcodingParam->stream_index] = transcodingParam->stream[2]
    ;
    dVar2 = *lpcGains;
    dVar3 = lpcGains[1];
    dVar4 = lpcGains[2];
    dVar5 = lpcGains[3];
    dVar6 = lpcGains[5];
    (ISACencUB_obj->SaveEnc_obj).lpcGain[4] = lpcGains[4];
    (ISACencUB_obj->SaveEnc_obj).lpcGain[5] = dVar6;
    (ISACencUB_obj->SaveEnc_obj).lpcGain[2] = dVar4;
    (ISACencUB_obj->SaveEnc_obj).lpcGain[3] = dVar5;
    (ISACencUB_obj->SaveEnc_obj).lpcGain[0] = dVar2;
    (ISACencUB_obj->SaveEnc_obj).lpcGain[1] = dVar3;
    WebRtcIsac_EncodeLpcGainUb
              (transcodingParam->loFiltGain,&ISACencUB_obj->bitstr_obj,
               (ISACencUB_obj->SaveEnc_obj).lpcGainIndex);
    if (band == kIsacUpperBand16) {
      dVar2 = lpcGains[6];
      dVar3 = lpcGains[7];
      dVar4 = lpcGains[8];
      dVar5 = lpcGains[9];
      dVar6 = lpcGains[0xb];
      (ISACencUB_obj->SaveEnc_obj).lpcGain[10] = lpcGains[10];
      (ISACencUB_obj->SaveEnc_obj).lpcGain[0xb] = dVar6;
      (ISACencUB_obj->SaveEnc_obj).lpcGain[8] = dVar4;
      (ISACencUB_obj->SaveEnc_obj).lpcGain[9] = dVar5;
      (ISACencUB_obj->SaveEnc_obj).lpcGain[6] = dVar2;
      (ISACencUB_obj->SaveEnc_obj).lpcGain[7] = dVar3;
      WebRtcIsac_EncodeLpcGainUb
                (lpGains,&ISACencUB_obj->bitstr_obj,(ISACencUB_obj->SaveEnc_obj).lpcGainIndex + 6);
    }
    uVar1 = (ISACencUB_obj->bitstr_obj).stream_index;
    memcpy(&(ISACencUB_obj->SaveEnc_obj).bitStreamObj,ISACencUB_obj,0x264);
    status = WebRtcIsac_EncodeSpec(fre,fim,0,band,&ISACencUB_obj->bitstr_obj);
    if (status < 0 && status != -0x1928) break;
    bytesLeftSpecCoding = (double)(uVar10 - uVar1);
    iVar9 = iVar9 + 1;
    if ((status != -0x1928) && ((ISACencUB_obj->bitstr_obj).stream_index <= uVar10)) {
      return 0;
    }
  }
  return status;
}

Assistant:

static int LimitPayloadUb(ISACUBEncStruct* ISACencUB_obj,
                          uint16_t payloadLimitBytes,
                          double bytesLeftSpecCoding,
                          transcode_obj* transcodingParam,
                          int16_t* fre, int16_t* fim,
                          double* lpcGains, enum ISACBand band, int status) {

  int iterCntr = 0;
  int k;
  double bytesSpecCoderUsed;
  double transcodeScale;
  const int16_t kAveragePitchGain = 0.0;

  do {
    if (iterCntr >= MAX_PAYLOAD_LIMIT_ITERATION) {
      /* We were not able to limit the payload size. */
      return -ISAC_PAYLOAD_LARGER_THAN_LIMIT;
    }

    if (status == -ISAC_DISALLOWED_BITSTREAM_LENGTH) {
      bytesSpecCoderUsed = STREAM_SIZE_MAX;
      /* Being conservative. */
      transcodeScale = bytesLeftSpecCoding / bytesSpecCoderUsed * 0.5;
    } else {
      bytesSpecCoderUsed = ISACencUB_obj->bitstr_obj.stream_index -
          transcodingParam->stream_index;
      transcodeScale = bytesLeftSpecCoding / bytesSpecCoderUsed;
    }

    /* To be safe, we reduce the scale depending on the
       number of iterations. */
    transcodeScale *= (1.0 - (0.9 * (double)iterCntr /
        (double)MAX_PAYLOAD_LIMIT_ITERATION));

    /* Scale the LPC Gains. */
    if (band == kIsacUpperBand16) {
      /* Two sets of coefficients if 16 kHz. */
      for (k = 0; k < SUBFRAMES; k++) {
        transcodingParam->loFiltGain[k] *= transcodeScale;
        transcodingParam->hiFiltGain[k] *= transcodeScale;
      }
    } else {
      /* One sets of coefficients if 12 kHz. */
      for (k = 0; k < SUBFRAMES; k++) {
        transcodingParam->loFiltGain[k] *= transcodeScale;
      }
    }

    /* Scale DFT coefficients. */
    for (k = 0; k < FRAMESAMPLES_HALF; k++) {
      fre[k] = (int16_t)(fre[k] * transcodeScale + 0.5);
      fim[k] = (int16_t)(fim[k] * transcodeScale + 0.5);
    }
    /* Store FFT coefficients for multiple encoding. */
    memcpy(ISACencUB_obj->SaveEnc_obj.realFFT, fre,
          sizeof(ISACencUB_obj->SaveEnc_obj.realFFT));
    memcpy(ISACencUB_obj->SaveEnc_obj.imagFFT, fim,
           sizeof(ISACencUB_obj->SaveEnc_obj.imagFFT));

    /* Store the state of arithmetic coder before coding LPC gains */
    ISACencUB_obj->bitstr_obj.W_upper = transcodingParam->W_upper;
    ISACencUB_obj->bitstr_obj.stream_index = transcodingParam->stream_index;
    ISACencUB_obj->bitstr_obj.streamval = transcodingParam->streamval;
    ISACencUB_obj->bitstr_obj.stream[transcodingParam->stream_index - 2] =
        transcodingParam->stream[0];
    ISACencUB_obj->bitstr_obj.stream[transcodingParam->stream_index - 1] =
        transcodingParam->stream[1];
    ISACencUB_obj->bitstr_obj.stream[transcodingParam->stream_index] =
        transcodingParam->stream[2];

    /* Store the gains for multiple encoding. */
    memcpy(ISACencUB_obj->SaveEnc_obj.lpcGain, lpcGains,
           SUBFRAMES * sizeof(double));
    /* Entropy Code lpc-gains, indices are stored for a later use.*/
    WebRtcIsac_EncodeLpcGainUb(transcodingParam->loFiltGain,
                               &ISACencUB_obj->bitstr_obj,
                               ISACencUB_obj->SaveEnc_obj.lpcGainIndex);

    /* If 16kHz should do one more set. */
    if (band == kIsacUpperBand16) {
      /* Store the gains for multiple encoding. */
      memcpy(&ISACencUB_obj->SaveEnc_obj.lpcGain[SUBFRAMES],
             &lpcGains[SUBFRAMES], SUBFRAMES * sizeof(double));
      /* Entropy Code lpc-gains, indices are stored for a later use.*/
      WebRtcIsac_EncodeLpcGainUb(
          transcodingParam->hiFiltGain, &ISACencUB_obj->bitstr_obj,
          &ISACencUB_obj->SaveEnc_obj.lpcGainIndex[SUBFRAMES]);
    }

    /* Update the number of bytes left for encoding the spectrum. */
    bytesLeftSpecCoding = payloadLimitBytes -
        ISACencUB_obj->bitstr_obj.stream_index;

    /* Save the bit-stream object at this point for FEC. */
    memcpy(&ISACencUB_obj->SaveEnc_obj.bitStreamObj,
           &ISACencUB_obj->bitstr_obj, sizeof(Bitstr));

    /* Encode the spectrum. */
    status = WebRtcIsac_EncodeSpec(fre, fim, kAveragePitchGain,
                                   band, &ISACencUB_obj->bitstr_obj);
    if ((status < 0) && (status != -ISAC_DISALLOWED_BITSTREAM_LENGTH)) {
      /* There has been an error but it was not too large payload
         (we can cure too large payload). */
      return status;
    }
    iterCntr++;
  } while ((ISACencUB_obj->bitstr_obj.stream_index > payloadLimitBytes) ||
      (status == -ISAC_DISALLOWED_BITSTREAM_LENGTH));
  return 0;
}